

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

int prop_compare(void *p1,void *p2)

{
  uint uVar1;
  uint uVar2;
  void *in_RSI;
  void *in_RDI;
  uint id2;
  uint id1;
  uint local_1c;
  
  uVar1 = osrp2(in_RDI);
  uVar2 = osrp2(in_RSI);
  if (uVar1 < uVar2) {
    local_1c = 0xffffffff;
  }
  else {
    local_1c = (uint)(uVar1 != uVar2);
  }
  return local_1c;
}

Assistant:

static int prop_compare(const void *p1, const void *p2)
    {
        uint id1, id2;

        /* get the ID's */
        id1 = osrp2(p1);
        id2 = osrp2(p2);

        /* compare them and return the result */
        return (id1 < id2 ? -1 : id1 == id2 ? 0 : 1);
    }